

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapCPPCommand.cxx
# Opt level: O2

bool cmQTWrapCPPCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  __single_object _Var1;
  bool bVar2;
  ulong uVar3;
  string *__x;
  string *psVar4;
  cmSourceFile *this_00;
  string *psVar5;
  cmSourceFile *this_01;
  cmValue value;
  string *sourceName;
  string *name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  string_view value_00;
  __single_object cc;
  string hname;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_180;
  undefined1 local_178 [24];
  char *pcStack_160;
  size_type local_158;
  pointer local_150;
  size_type local_148;
  pointer local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string sourceListValue;
  string newName;
  cmCustomCommandLines commandLines;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string srcName;
  string local_50;
  
  uVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_178,"called with incorrect number of arguments",
               (allocator<char> *)&hname);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    psVar4 = (string *)local_178;
  }
  else {
    this = status->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_178,"QT_MOC_EXECUTABLE",(allocator<char> *)&hname);
    __x = cmMakefile::GetRequiredDefinition(this,(string *)local_178);
    std::__cxx11::string::~string((string *)local_178);
    name = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 1;
    psVar4 = cmMakefile::GetSafeDefinition(this,name);
    std::__cxx11::string::string((string *)&sourceListValue,(string *)psVar4);
    psVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (sourceName = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 2; sourceName != psVar4;
        sourceName = sourceName + 1) {
      this_00 = cmMakefile::GetSource(this,sourceName,Ambiguous);
      if (this_00 == (cmSourceFile *)0x0) {
LAB_0026a4ea:
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&srcName,sourceName);
        psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
        local_178._8_8_ = (psVar5->_M_dataplus)._M_p;
        local_178._0_8_ = psVar5->_M_string_length;
        hname._M_dataplus._M_p = &DAT_00000005;
        hname._M_string_length = (size_type)anon_var_dwarf_920d6a;
        cmStrCat<std::__cxx11::string,char[5]>
                  (&newName,(cmAlphaNum *)local_178,(cmAlphaNum *)&hname,&srcName,
                   (char (*) [5])0x5cca7d);
        this_01 = cmMakefile::GetOrCreateSource(this,&newName,true,Ambiguous);
        if (this_00 != (cmSourceFile *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_178,"ABSTRACT",(allocator<char> *)&commandLines);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&hname,"ABSTRACT",(allocator<char> *)&depends);
          value = cmSourceFile::GetProperty(this_00,&hname);
          cmSourceFile::SetProperty(this_01,(string *)local_178,value);
          std::__cxx11::string::~string((string *)&hname);
          std::__cxx11::string::~string((string *)local_178);
        }
        hname._M_dataplus._M_p = (pointer)&hname.field_2;
        hname._M_string_length = 0;
        hname.field_2._M_local_buf[0] = '\0';
        bVar2 = cmsys::SystemTools::FileIsFullPath(sourceName);
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)&hname);
        }
        else {
          if (this_00 == (cmSourceFile *)0x0) {
LAB_0026a61b:
            cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          }
          else {
            bVar2 = cmSourceFile::GetIsGenerated(this_00,GlobalAndLocal);
            if (!bVar2) goto LAB_0026a61b;
            cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
          }
          std::__cxx11::string::_M_assign((string *)&hname);
          std::__cxx11::string::append((char *)&hname);
          std::__cxx11::string::append((string *)&hname);
        }
        if (sourceListValue._M_string_length != 0) {
          std::__cxx11::string::append((char *)&sourceListValue);
        }
        std::__cxx11::string::append((string *)&sourceListValue);
        local_178._8_8_ = (__x->_M_dataplus)._M_p;
        local_178._0_8_ = __x->_M_string_length;
        local_178._16_8_ = 2;
        pcStack_160 = "-o";
        local_158 = newName._M_string_length;
        local_150 = newName._M_dataplus._M_p;
        local_148 = hname._M_string_length;
        local_140 = hname._M_dataplus._M_p;
        ilist._M_len = 4;
        ilist._M_array = (iterator)local_178;
        cmMakeSingleCommandLine(&commandLines,ilist);
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,__x);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&hname);
        std::make_unique<cmCustomCommand>();
        _Var1 = cc;
        std::__cxx11::string::string((string *)&local_50,(string *)&newName);
        cmCustomCommand::SetOutputs
                  ((cmCustomCommand *)
                   _Var1._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        _Var1 = cc;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_88,&depends);
        cmCustomCommand::SetDepends
                  ((cmCustomCommand *)
                   _Var1._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,&local_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        _Var1 = cc;
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                  (&local_a0,
                   &commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
        cmCustomCommand::SetCommandLines
                  ((cmCustomCommand *)
                   _Var1._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                   (cmCustomCommandLines *)&local_a0);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_a0);
        cmCustomCommand::SetComment
                  ((cmCustomCommand *)
                   cc._M_t.
                   super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                   super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,"Qt Wrapped File");
        local_180._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
        ._M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
        super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)cc;
        cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
        super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
        super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
             (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
        local_178._16_8_ = 0;
        pcStack_160 = (char *)0x0;
        local_178._0_8_ = (pointer)0x0;
        local_178._8_8_ = (char *)0x0;
        cmMakefile::AddCustomCommandToOutput
                  (this,&local_180,(CommandSourceCallback *)local_178,false);
        std::_Function_base::~_Function_base((_Function_base *)local_178);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_180);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&depends);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
        std::__cxx11::string::~string((string *)&hname);
        std::__cxx11::string::~string((string *)&newName);
        std::__cxx11::string::~string((string *)&srcName);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_178,"WRAP_EXCLUDE",(allocator<char> *)&hname);
        bVar2 = cmSourceFile::GetPropertyAsBool(this_00,(string *)local_178);
        std::__cxx11::string::~string((string *)local_178);
        if (!bVar2) goto LAB_0026a4ea;
      }
    }
    value_00._M_str = sourceListValue._M_dataplus._M_p;
    value_00._M_len = sourceListValue._M_string_length;
    cmMakefile::AddDefinition(this,name,value_00);
    psVar4 = &sourceListValue;
  }
  std::__cxx11::string::~string((string *)psVar4);
  return 0x40 < uVar3;
}

Assistant:

bool cmQTWrapCPPCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the moc executable to run in the custom command.
  std::string const& moc_exe = mf.GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& sourceList = args[1];
  std::string sourceListValue = mf.GetSafeDefinition(sourceList);

  // Create a rule for all sources listed.
  for (std::string const& arg : cmMakeRange(args).advance(2)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should wrap the class
    if (!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE"))) {
      // Compute the name of the file to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(arg);
      std::string newName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), "/moc_", srcName, ".cxx");
      cmSourceFile* sf = mf.GetOrCreateSource(newName, true);
      if (curr) {
        sf->SetProperty("ABSTRACT", curr->GetProperty("ABSTRACT"));
      }

      // Compute the name of the header from which to generate the file.
      std::string hname;
      if (cmSystemTools::FileIsFullPath(arg)) {
        hname = arg;
      } else {
        if (curr && curr->GetIsGenerated()) {
          hname = mf.GetCurrentBinaryDirectory();
        } else {
          hname = mf.GetCurrentSourceDirectory();
        }
        hname += "/";
        hname += arg;
      }

      // Append the generated source file to the list.
      if (!sourceListValue.empty()) {
        sourceListValue += ";";
      }
      sourceListValue += newName;

      // Create the custom command to generate the file.
      cmCustomCommandLines commandLines =
        cmMakeSingleCommandLine({ moc_exe, "-o", newName, hname });

      std::vector<std::string> depends;
      depends.push_back(moc_exe);
      depends.push_back(hname);

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(newName);
      cc->SetDepends(depends);
      cc->SetCommandLines(commandLines);
      cc->SetComment("Qt Wrapped File");
      mf.AddCustomCommandToOutput(std::move(cc));
    }
  }

  // Store the final list of source files.
  mf.AddDefinition(sourceList, sourceListValue);
  return true;
}